

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d63_qx_inside_interval.cpp
# Opt level: O0

int main(void)

{
  mapped_type mVar1;
  bool bVar2;
  istream *piVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  ostream *poVar6;
  int iVar7;
  bool bVar8;
  _Self local_70;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_68;
  iterator it;
  int x;
  mapped_type local_50;
  int local_4c;
  int b;
  int a;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> d;
  int local_10;
  int n;
  int m;
  
  n = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>
            (piVar3,(int *)((long)&d._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&b);
  while (iVar7 = local_10 + -1, bVar8 = local_10 != 0, local_10 = iVar7, bVar8) {
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_4c);
    std::istream::operator>>(piVar3,&local_50);
    mVar1 = local_50;
    pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&b,&local_4c);
    *pmVar4 = mVar1;
  }
  while (d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0) {
    d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + -1;
    std::istream::operator>>((istream *)&std::cin,(int *)&it);
    local_68._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
         lower_bound((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &b,(key_type *)&it);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_68);
    if (ppVar5->first == (int)it._M_node) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
      std::operator<<(poVar6," ");
    }
    else {
      local_70._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &b);
      bVar2 = std::operator==(&local_68,&local_70);
      bVar8 = true;
      if (!bVar2) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_68);
        bVar8 = (int)it._M_node < ppVar5->first;
      }
      if (bVar8) {
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator--(&local_68,0);
        bVar8 = check_range((iterator)local_68._M_node,(int)it._M_node);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bVar8);
        std::operator<<(poVar6," ");
      }
    }
  }
  d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + -1;
  std::operator<<((ostream *)&std::cout,"\n");
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)&b);
  return n;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);

    int m, n;
    cin >> m >> n;
    map<int, int> d;

    while (m--) {
        int a, b;
        cin >> a >> b;

        d[a] = b;
    }

    while (n--) {
        int x;
        cin >> x;
        auto it = d.lower_bound(x);
        if (it->first == x) {
            cout << 1 << " ";
        } else if (it == d.end() || it->first > x) {
            it--;
            cout << check_range(it, x) << " ";
        }
    }
    cout << "\n";
}